

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
::
emplaceRealloc<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          (SmallVectorBase<std::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
           *this,pointer pos,
          span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  size_t sVar3;
  undefined8 uVar4;
  pointer psVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar2 * 2) {
    uVar9 = uVar2 * 2;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar10 = (long)pos - *(long *)this;
  puVar6 = (undefined8 *)operator_new(uVar9 << 4);
  sVar3 = (args->_M_extent)._M_extent_value;
  *(undefined8 *)((long)puVar6 + lVar10) = args->_M_ptr;
  ((undefined8 *)((long)puVar6 + lVar10))[1] = sVar3;
  p = *(pointer *)this;
  lVar7 = *(long *)(this + 8) * 0x10;
  lVar8 = (long)p + (lVar7 - (long)pos);
  psVar5 = p;
  puVar1 = puVar6;
  if (lVar8 == 0) {
    if (*(long *)(this + 8) != 0) {
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->_M_ptr + lVar8);
        uVar4 = puVar1[1];
        *(undefined8 *)((long)puVar6 + lVar8) = *puVar1;
        ((undefined8 *)((long)puVar6 + lVar8))[1] = uVar4;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 != lVar8);
    }
  }
  else {
    for (; psVar5 != pos; psVar5 = psVar5 + 1) {
      sVar3 = (psVar5->_M_extent)._M_extent_value;
      *puVar1 = psVar5->_M_ptr;
      puVar1[1] = sVar3;
      puVar1 = puVar1 + 2;
    }
    memcpy((void *)((long)puVar6 + lVar10 + 0x10),pos,(lVar8 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(undefined8 **)this = puVar6;
  return (pointer)((long)puVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}